

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirewirePort.cpp
# Opt level: O3

nodeid_t __thiscall FirewirePort::InitNodes(FirewirePort *this)

{
  long lVar1;
  long lVar2;
  ushort uVar3;
  short sVar4;
  uint uVar5;
  ostream *poVar6;
  
  uVar3 = raw1394_get_local_id(this->handle);
  this->baseNodeId = uVar3 & 0xffc0;
  poVar6 = (this->super_BasePort).outStr;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"FirewirePort::InitNodes: base node id = ",0x28);
  *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
       *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  lVar1 = *(long *)poVar6;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar6 + lVar2 + 0x18) = *(uint *)(poVar6 + lVar2 + 0x18) & 0xffffffb5 | 2;
  std::ios::widen((char)*(undefined8 *)(lVar1 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  uVar5 = raw1394_get_generation(this->handle);
  (this->super_BasePort).FwBusGeneration = uVar5;
  (this->super_BasePort).newFwBusGeneration = uVar5;
  sVar4 = raw1394_get_nodecount(this->handle);
  return sVar4 - 1;
}

Assistant:

nodeid_t FirewirePort::InitNodes(void)
{
    // Get base node id (zero out 6 lsb)
    baseNodeId = raw1394_get_local_id(handle) & 0xFFC0;
    outStr << "FirewirePort::InitNodes: base node id = " << std::hex << baseNodeId << std::dec << std::endl;

    // Get Firewire bus generation
    FwBusGeneration = raw1394_get_generation(handle);
    newFwBusGeneration = FwBusGeneration;

    // Get total number of nodes on bus
    int numNodes = raw1394_get_nodecount(handle);
    // Subtract 1 for PC which, as bus master, is always the highest number
    return (numNodes-1);
}